

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evmap.c
# Opt level: O2

int evmap_signal_foreach_event_fn(event_base *base,int signum,evmap_signal *sig_info,void *arg)

{
  event *peVar1;
  int iVar2;
  
  do {
    peVar1 = (((anon_struct_32_2_255328d7_for_ev_io *)sig_info)->ev_io_next).le_next;
    if (peVar1 == (event *)0x0) {
      return 0;
    }
    iVar2 = (**arg)(base,peVar1,*(undefined8 *)((long)arg + 8));
    sig_info = (evmap_signal *)&peVar1->ev_;
  } while (iVar2 == 0);
  return iVar2;
}

Assistant:

static int
evmap_signal_foreach_event_fn(struct event_base *base, int signum,
    struct evmap_signal *sig_info, void *arg)
{
	struct event *ev;
	struct evmap_foreach_event_helper *h = arg;
	int r;
	LIST_FOREACH(ev, &sig_info->events, ev_signal_next) {
		if ((r = h->fn(base, ev, h->arg)))
			return r;
	}
	return 0;
}